

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cpp
# Opt level: O2

string * __thiscall
sqlcheck::RiskLevelToString_abi_cxx11_
          (string *__return_storage_ptr__,sqlcheck *this,RiskLevel *risk_level)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(*(undefined4 *)this) {
  case 0:
    pcVar2 = "ALL ANTI-PATTERNS";
    paVar1 = &local_d;
    break;
  case 1:
    pcVar2 = "HINTS";
    paVar1 = &local_c;
    break;
  case 2:
    pcVar2 = "LOW RISK";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "MEDIUM RISK";
    paVar1 = &local_a;
    break;
  case 4:
    pcVar2 = "HIGH RISK";
    paVar1 = &local_9;
    break;
  default:
    pcVar2 = "INVALID";
    paVar1 = &local_e;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string RiskLevelToString(const RiskLevel& risk_level){

  switch (risk_level) {
    case RISK_LEVEL_HIGH:
      return "HIGH RISK";
    case RISK_LEVEL_MEDIUM:
      return "MEDIUM RISK";
    case RISK_LEVEL_LOW:
      return "LOW RISK";
    case RISK_LEVEL_NONE:
      return "HINTS";
    case RISK_LEVEL_ALL:
      return "ALL ANTI-PATTERNS";

    case RISK_LEVEL_INVALID:
    default:
      return "INVALID";
  }

}